

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QSize __thiscall
QStyleSheetStyle::sizeFromContents
          (QStyleSheetStyle *this,ContentsType ct,QStyleOption *opt,QSize *csz,QWidget *w)

{
  QStyleSheetStyle *pQVar1;
  Data *pDVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QStyle *pQVar11;
  QSize QVar12;
  QPalettePrivate *pQVar13;
  QSize QVar14;
  undefined8 uVar15;
  long lVar16;
  qsizetype qVar17;
  Representation RVar18;
  undefined4 uVar19;
  ulong uVar20;
  ulong uVar21;
  QVariant *val;
  QPalettePrivate *pQVar22;
  QSize QVar23;
  Representation RVar24;
  long in_FS_OFFSET;
  QRect QVar25;
  undefined1 auVar26 [16];
  QByteArrayView layout;
  QFontMetrics fm;
  QFontMetrics fm_2;
  QRenderRule subSubRule;
  QRenderRule rule;
  QRenderRule subRule;
  QSize local_208;
  QSize local_200;
  QArrayDataPointer<QVariant> local_1f8;
  undefined1 local_1d8 [8];
  QPalettePrivate *pQStack_1d0;
  undefined1 *local_1c8;
  QRenderRule local_150;
  undefined1 local_c8 [32];
  bool local_a8;
  QSharedDataPointer<QStyleSheetBoxData> local_90;
  QSharedDataPointer<QStyleSheetBorderData> local_80;
  QSharedDataPointer<QStyleSheetGeometryData> local_70;
  QSharedDataPointer<QStyleSheetImageData> local_60;
  long local_38;
  
  pQVar1 = globalStyleSheetStyle;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar11 = baseStyle(this);
    QVar12 = (QSize)(**(code **)(*(long *)pQVar11 + 0xe8))(pQVar11,ct,opt,csz,w);
    uVar20 = (ulong)QVar12 >> 0x20;
    goto LAB_003659e4;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&local_150,0xaa,0x88);
  renderRule(&local_150,this,&w->super_QObject,opt,0);
  local_200 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QVar12 = QRenderRule::adjustSize(&local_150,csz);
  if (CT_ItemViewItem < ct) goto switchD_00364a30_caseD_11;
  local_200.wd = QVar12.wd.m_i;
  uVar20 = (ulong)QVar12 >> 0x20;
  local_200.ht = QVar12.ht.m_i;
  iVar10 = (int)opt;
  local_200 = QVar12;
  switch(ct) {
  case CT_PushButton:
  case CT_ComboBox:
    goto switchD_00364a30_caseD_0;
  case CT_CheckBox:
  case CT_RadioButton:
    if ((((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 2)) ||
       ((local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0 &&
         local_150.b.d.ptr == (QStyleSheetBoxData *)0x0 &&
        (bVar3 = hasStyleRule(this,&w->super_QObject,5), QVar12 = local_200, !bVar3)))) break;
    bVar3 = ct == CT_RadioButton;
    uVar19 = 0x43;
    if (bVar3) {
      uVar19 = 0x4a;
    }
    iVar10 = (**(code **)(*(long *)this + 0xe0))(this,bVar3 * '\x02' + '%',opt,w);
    RVar18.m_i = (**(code **)(*(long *)this + 0xe0))(this,bVar3 * '\x02' + '&',opt,w);
    iVar7 = (**(code **)(*(long *)this + 0xe0))(this,uVar19,opt,w);
    if (RVar18.m_i < local_200.ht.m_i) {
      RVar18.m_i = local_200.ht.m_i;
    }
    local_200.ht.m_i = RVar18.m_i;
    local_200.wd.m_i = local_200.wd.m_i + iVar7 + iVar10;
    goto LAB_00365428;
  case CT_ToolButton:
    if ((local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       ((local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d)
          .ptr == (QStyleSheetBorderImageData *)0x0 &&
         (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) == BorderStyle_Native)))))) {
      bVar3 = QRenderRule::baseStyleCanDraw(&local_150);
      QVar12 = local_200;
      if (bVar3) goto switchD_00364a30_caseD_0;
    }
    local_200.ht.m_i = local_200.ht.m_i + 3;
    local_200.wd.m_i = local_200.wd.m_i + 3;
    QVar12 = local_200;
    goto switchD_00364a30_caseD_0;
  case CT_Splitter:
  case CT_MenuBarItem:
    iVar10 = 10;
    if (ct == CT_Splitter) {
      iVar10 = 0x20;
    }
    memset((QRenderRule *)local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,iVar10);
    if (local_80.d.ptr != (QStyleSheetBorderData *)0x0 ||
        local_90.d.ptr != (QStyleSheetBoxData *)0x0) {
      QVar12 = QRenderRule::boxSize((QRenderRule *)local_c8,&local_200,7);
      uVar20 = (ulong)QVar12 >> 0x20;
      goto LAB_00365c3f;
    }
    goto LAB_00365991;
  case CT_ProgressBar:
  case CT_SizeGrip:
    if (((local_150.geo.d.ptr == (QStyleSheetGeometryData *)0x0) ||
        ((*(int *)((long)local_150.geo.d.ptr + 0xc) == -1 &&
         (*(int *)((long)local_150.geo.d.ptr + 0x10) == -1)))) &&
       ((local_150.img.d.ptr == (QStyleSheetImageData *)0x0 ||
        (((((QSize *)((long)local_150.img.d.ptr + 0x14))->wd).m_i < 0 ||
         (((Representation *)((long)local_150.img.d.ptr + 0x18))->m_i < 0)))))) {
      pQVar11 = baseStyle(this);
      local_c8._0_8_ = (**(code **)(*(long *)pQVar11 + 0xe8))(pQVar11,ct,opt,&local_200,w);
      QVar12 = QRenderRule::boxSize(&local_150,(QSize *)local_c8,7);
    }
    else {
      QVar12 = QRenderRule::size(&local_150,&local_200);
    }
    goto LAB_003659c0;
  case CT_MenuItem:
    if (((opt != (QStyleOption *)0x0) && (0 < opt->version)) && (opt->type == 4)) {
      iVar7 = opt[1].version;
      iVar8 = 10;
      if (iVar7 == 2) {
        iVar8 = 0x26;
      }
      memset(local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,iVar8);
      if (iVar7 == 2) {
        if (((local_70.d.ptr != (QStyleSheetGeometryData *)0x0) &&
            ((*(int *)((long)local_70.d.ptr + 0xc) != -1 ||
             (*(int *)((long)local_70.d.ptr + 0x10) != -1)))) ||
           ((local_60.d.ptr != (QStyleSheetImageData *)0x0 &&
            ((-1 < (((QSize *)((long)local_60.d.ptr + 0x14))->wd).m_i &&
             (-1 < ((Representation *)((long)local_60.d.ptr + 0x18))->m_i)))))) {
          QVar12 = (QSize)((ulong)local_200 & 0xffffffff);
          QVar14 = QRenderRule::size((QRenderRule *)local_c8);
          goto LAB_00365c33;
        }
      }
      else if ((local_80.d.ptr != (QStyleSheetBorderData *)0x0 ||
                local_90.d.ptr != (QStyleSheetBoxData *)0x0) || (local_a8 == true)) {
        cVar4 = *(char *)((long)&opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                                 super_QFlagsStorage<QStyle::StateFlag>.i + 1);
        lVar16 = QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
        QVar12 = *csz;
        QVar23 = QVar12;
        local_1f8.d = (Data *)QVar12;
        if (local_a8 == true) {
          local_208 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
          QFont::resolve((QFont *)local_1d8);
          QFontMetrics::QFontMetrics((QFontMetrics *)&local_208,(QFont *)local_1d8);
          QFont::~QFont((QFont *)local_1d8);
          local_1d8._0_4_ = 0;
          local_1d8._4_4_ = 0;
          pQStack_1d0 = (QPalettePrivate *)0xffffffffffffffff;
          auVar26 = QFontMetrics::boundingRect
                              ((QRect *)&local_208,(int)local_1d8,(QString *)0x900,iVar10 + 0x60,
                               (int *)0x0);
          QVar23.wd.m_i = (auVar26._8_4_ - auVar26._0_4_) + 1;
          uVar6 = (auVar26._12_4_ - auVar26._4_4_) + 1;
          QVar23.ht.m_i = 0;
          if ((int)QVar23.wd.m_i < QVar12.wd.m_i.m_i) {
            QVar23 = (QSize)((ulong)QVar12 & 0xffffffff);
          }
          uVar20 = (ulong)uVar6;
          if ((int)uVar6 < QVar12.ht.m_i.m_i) {
            uVar20 = (ulong)QVar12 >> 0x20;
          }
          local_1f8.d = (Data *)((uVar20 << 0x20) + (long)QVar23);
          QFontMetrics::~QFontMetrics((QFontMetrics *)&local_208);
        }
        pQStack_1d0 = opt[1].palette.d;
        local_1d8._0_4_ = opt[1].palette.currentGroup;
        local_1d8._4_4_ = *(undefined4 *)&opt[1].palette.field_0xc;
        qVar17 = QStringView::indexOf((QStringView *)local_1d8,(QChar)0x9,0,CaseSensitive);
        RVar18.m_i = QVar23.wd.m_i.m_i + 0xc;
        if (qVar17 == -1) {
          RVar18.m_i = QVar23.wd.m_i.m_i;
        }
        cVar5 = QIcon::isNull();
        if (cVar5 == '\0') {
          local_1d8._4_4_ = (**(code **)(*(long *)this + 0xe0))(this,0x3e,0,0);
          local_1d8._0_4_ = local_1d8._4_4_;
          iVar10 = QIcon::actualSize((QSize *)&opt[1].styleObject,(Mode)local_1d8,On);
          if (iVar10 < opt[2].version) {
            iVar10 = opt[2].version;
          }
          local_1f8.d = (Data *)CONCAT44(local_1f8.d._4_4_,iVar10 + RVar18.m_i + 4);
        }
        else if ((lVar16 == 0) && (cVar4 != '\0')) {
          memset((QRenderRule *)local_1d8,0xaa,0x88);
          renderRule((QRenderRule *)local_1d8,this,&w->super_QObject,opt,0x25);
          QVar25 = positionRect(this,w,(QRenderRule *)local_c8,(QRenderRule *)local_1d8,0x25,
                                &opt->rect,opt->direction);
          iVar10 = (QVar25.x2.m_i.m_i - QVar25.x1.m_i) + 1;
          if (iVar10 < opt[2].version) {
            iVar10 = opt[2].version;
          }
          local_1f8.d = (Data *)CONCAT44(local_1f8.d._4_4_,iVar10 + RVar18.m_i + 4);
          QRenderRule::~QRenderRule((QRenderRule *)local_1d8);
        }
        else {
          local_1f8.d = (Data *)CONCAT44(local_1f8.d._4_4_,RVar18.m_i + opt[2].version);
        }
        local_1d8 = (undefined1  [8])
                    QRenderRule::adjustSize((QRenderRule *)local_c8,(QSize *)&local_1f8);
        QVar14 = QRenderRule::boxSize((QRenderRule *)local_c8,(QSize *)local_1d8,7);
        QVar12 = QVar14;
        goto LAB_00365c33;
      }
      goto LAB_00365991;
    }
    break;
  default:
    if (local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0 &&
        local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) break;
    goto LAB_003659c4;
  case CT_TabBarTab:
    memset((QRenderRule *)local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x2e);
    if (((local_90.d.ptr != (QStyleSheetBoxData *)0x0) ||
        ((local_80.d.ptr != (QStyleSheetBorderData *)0x0 &&
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_80.d.ptr + 0x68))->d).
           ptr != (QStyleSheetBorderImageData *)0x0 ||
          (*(BorderStyle *)((long)local_80.d.ptr + 0x38) != BorderStyle_Native)))))) ||
       (local_a8 == true)) {
      local_1d8._0_4_ = 0;
      local_1d8._4_4_ = 0;
      pQStack_1d0 = (QPalettePrivate *)0x0;
      local_1c8 = (undefined1 *)0x0;
      if ((opt == (QStyleOption *)0x0) || (opt->version < 1)) {
        bVar3 = false;
        iVar7 = 0;
      }
      else {
        bVar3 = false;
        iVar7 = 0;
        if (opt->type == 3) {
          cVar4 = QIcon::isNull();
          iVar7 = 0xc;
          if (cVar4 != '\0') {
            iVar7 = 0;
          }
          bVar3 = (opt[1].version - 2U & 0xfffffffa) == 0;
          QString::operator=((QString *)local_1d8,(QString *)&opt[1].state);
        }
      }
      if ((local_90.d.ptr != (QStyleSheetBoxData *)0x0) ||
         ((local_80.d.ptr != (QStyleSheetBorderData *)0x0 &&
          (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_80.d.ptr + 0x68))->d).
            ptr != (QStyleSheetBorderImageData *)0x0 ||
           (*(BorderStyle *)((long)local_80.d.ptr + 0x38) != BorderStyle_Native)))))) {
        iVar8 = iVar7;
        if (bVar3 != false) {
          iVar8 = 0;
        }
        iVar9 = 0;
        if (bVar3 != false) {
          iVar9 = iVar7;
        }
        local_200.wd.m_i = iVar8 + (csz->wd).m_i;
        local_200.ht.m_i = iVar9 + (csz->ht).m_i;
      }
      if (local_a8 == true) {
        iVar10 = QFontMetrics::size(iVar10 + 0x20,(QString *)0x800,(int)local_1d8,(int *)0x0);
        (&local_200.wd)[bVar3].m_i = (&local_200.wd)[bVar3].m_i - iVar10;
        local_1f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_1f8.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
        QFont::resolve((QFont *)&local_1f8);
        local_208 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_208,(QFont *)&local_1f8);
        uVar15 = QFontMetrics::size((int)&local_208,(QString *)0x800,(int)local_1d8,(int *)0x0);
        iVar10 = (int)((ulong)uVar15 >> 0x20);
        if (bVar3 == false) {
          RVar24.m_i = local_200.wd.m_i + (int)uVar15;
          RVar18.m_i = iVar10;
          if (iVar10 < local_200.ht.m_i) {
            RVar18.m_i = local_200.ht.m_i;
          }
        }
        else {
          RVar18.m_i = local_200.ht.m_i + (int)uVar15;
          RVar24.m_i = iVar10;
          if (iVar10 < local_200.wd.m_i) {
            RVar24.m_i = local_200.wd.m_i;
          }
        }
        local_200.ht.m_i = RVar18.m_i;
        local_200.wd.m_i = RVar24.m_i;
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_208);
        QFont::~QFont((QFont *)&local_1f8);
      }
      local_1f8.d = (Data *)QRenderRule::adjustSize((QRenderRule *)local_c8,&local_200);
      QVar12 = QRenderRule::boxSize((QRenderRule *)local_c8,(QSize *)&local_1f8,7);
      uVar20 = (ulong)QVar12 >> 0x20;
      if ((QSize)local_1d8 != (QSize)0x0) {
        LOCK();
        *(int *)local_1d8 = *(int *)local_1d8 + -1;
        UNLOCK();
        if (*(int *)local_1d8 == 0) {
          QArrayData::deallocate((QArrayData *)local_1d8,2,0x10);
        }
      }
      goto LAB_00365c3f;
    }
    local_200 = QRenderRule::adjustSize((QRenderRule *)local_c8,csz);
LAB_00365991:
    QRenderRule::~QRenderRule((QRenderRule *)local_c8);
    QVar12 = local_200;
    break;
  case CT_Slider:
    if (((local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0) ||
        (local_150.b.d.ptr != (QStyleSheetBoxData *)0x0)) ||
       (local_150.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) goto LAB_00365428;
    break;
  case CT_LineEdit:
  case CT_GroupBox:
    lVar16 = QMetaObject::cast((QObject *)&QAbstractSpinBox::staticMetaObject);
    if (lVar16 == 0) {
      if ((local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
         ((QVar12 = local_200, local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
          (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->
            d).ptr != (QStyleSheetBorderImageData *)0x0 ||
           (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) != BorderStyle_Native))))))
      goto LAB_00365428;
      break;
    }
    QVar12 = *csz;
    goto LAB_003659c0;
  case CT_SpinBox:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 0xf0002)) break;
    bVar3 = QRenderRule::baseStyleCanDraw(&local_150);
    if (bVar3) {
      pQVar11 = baseStyle(this);
      local_200 = (QSize)(**(code **)(*(long *)pQVar11 + 0xe8))(pQVar11,0xf,opt,&local_200,w);
    }
    else if (opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i != 2) {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0xb);
      bVar3 = QRenderRule::hasDrawable((QRenderRule *)local_c8);
      if (bVar3) {
        QVar25 = positionRect(this,w,&local_150,(QRenderRule *)local_c8,0xb,&opt->rect,
                              opt->direction);
        RVar18.m_i = ((QVar25.x2.m_i.m_i + local_200.wd.m_i) - QVar25.x1.m_i) + 1;
      }
      else {
        QVar12 = QRenderRule::size((QRenderRule *)local_c8);
        QVar12 = defaultSize(this,w,QVar12,&opt->rect,0xb);
        RVar18.m_i = QVar12.wd.m_i.m_i + local_200.wd.m_i;
      }
      local_200.wd.m_i = RVar18.m_i;
      QRenderRule::~QRenderRule((QRenderRule *)local_c8);
    }
    QVar12 = local_200;
    if (local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
        local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      local_200 = QRenderRule::boxSize(&local_150,&local_200,7);
      QVar12 = local_200;
    }
    goto LAB_003659c0;
  case CT_TabWidget:
  case CT_DialogButtons:
    break;
  case CT_HeaderSection:
    if (((opt != (QStyleOption *)0x0) && (0 < opt->version)) && (opt->type == 8)) {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x2a);
      if ((local_90.d.ptr == (QStyleSheetBoxData *)0x0 &&
           local_70.d.ptr == (QStyleSheetGeometryData *)0x0) &&
         (((local_80.d.ptr == (QStyleSheetBorderData *)0x0 ||
           (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_80.d.ptr + 0x68))->d).
             ptr == (QStyleSheetBorderImageData *)0x0 &&
            (*(BorderStyle *)((long)local_80.d.ptr + 0x38) == BorderStyle_Native)))) &&
          (local_a8 != true)))) {
        bVar3 = QRenderRule::baseStyleCanDraw((QRenderRule *)local_c8);
        if (bVar3) {
          pQVar11 = baseStyle(this);
          local_200 = (QSize)(**(code **)(*(long *)pQVar11 + 0xe8))(pQVar11,0x13,opt,&local_200,w);
        }
        else {
          local_200 = QWindowsStyle::sizeFromContents
                                ((QWindowsStyle *)this,CT_HeaderSection,opt,&local_200,w);
        }
        bVar3 = hasStyleRule(this,&w->super_QObject,0x2c);
        if ((bVar3) ||
           (bVar3 = hasStyleRule(this,&w->super_QObject,0x2b), QVar14 = local_200,
           QVar12 = local_200, bVar3)) {
          auVar26 = (**(code **)(*(long *)this + 0xc0))(this,0x11,opt,w);
          if (opt[2].version == 1) {
            local_200.wd.m_i = local_200.wd.m_i + (auVar26._8_4_ - auVar26._0_4_) + 1;
            QVar14 = local_200;
            QVar12 = local_200;
          }
          else {
            local_200.ht.m_i = local_200.ht.m_i + (auVar26._12_4_ - auVar26._4_4_) + 1;
            QVar14 = local_200;
            QVar12 = local_200;
          }
        }
      }
      else {
        local_200 = QRenderRule::adjustSize((QRenderRule *)local_c8,csz);
        if (((ulong)local_200 & 0x8000000080000000) != 0) {
          pQVar11 = baseStyle(this);
          uVar15 = (**(code **)(*(long *)pQVar11 + 0xe8))(pQVar11,0x13,opt,&local_200,w);
          if (local_200.wd.m_i < 0) {
            local_200.wd.m_i = (int)uVar15;
          }
          if ((long)local_200 < 0) {
            local_200.ht.m_i = (int)((ulong)uVar15 >> 0x20);
          }
        }
        if (local_70.d.ptr == (QStyleSheetGeometryData *)0x0) {
          cVar4 = QIcon::isNull();
          iVar7 = (**(code **)(*(long *)this + 0xe0))(this,0x2e,opt);
          iVar8 = 0;
          if (cVar4 == '\0') {
            iVar8 = (**(code **)(*(long *)this + 0xe0))(this,0x3e,opt);
          }
          local_1f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QFontMetrics::QFontMetrics((QFontMetrics *)&local_1f8,&opt->fontMetrics);
          if (local_a8 == true) {
            local_1d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
            pQStack_1d0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
            if (w == (QWidget *)0x0) {
              QFont::QFont((QFont *)local_1d8,(QFont *)(local_c8 + 0x10));
            }
            else {
              QFont::resolve((QFont *)local_1d8);
            }
            QFontMetrics::QFontMetrics((QFontMetrics *)&local_208,(QFont *)local_1d8);
            pDVar2 = local_1f8.d;
            local_1f8.d = (Data *)local_208;
            local_208 = (QSize)pDVar2;
            QFontMetrics::~QFontMetrics((QFontMetrics *)&local_208);
            QFont::~QFont((QFont *)local_1d8);
          }
          uVar15 = QFontMetrics::size((int)&local_1f8,(QString *)0x0,iVar10 + 0x48,(int *)0x0);
          iVar10 = (int)((ulong)uVar15 >> 0x20);
          if (iVar10 < iVar8) {
            iVar10 = iVar8;
          }
          RVar18.m_i = iVar10 + iVar7 * 2;
          iVar10 = iVar7;
          if (cVar4 != '\0') {
            iVar10 = 0;
          }
          lVar16._0_4_ = opt[1].rect.x1;
          lVar16._4_4_ = opt[1].rect.y1;
          iVar9 = 0;
          if (lVar16 != 0) {
            iVar9 = iVar7;
          }
          RVar24.m_i = iVar7 + iVar8 + (int)uVar15 + iVar10 + iVar9;
          if (RVar24.m_i < local_200.wd.m_i) {
            RVar24.m_i = local_200.wd.m_i;
          }
          if (RVar18.m_i < local_200.ht.m_i) {
            RVar18.m_i = local_200.ht.m_i;
          }
          local_200.ht.m_i = RVar18.m_i;
          local_200.wd.m_i = RVar24.m_i;
          QFontMetrics::~QFontMetrics((QFontMetrics *)&local_1f8);
        }
        QVar14 = QRenderRule::size((QRenderRule *)local_c8,&local_200);
        QVar12 = QVar14;
      }
      goto LAB_00365c33;
    }
    break;
  case CT_MdiControls:
    if ((((opt != (QStyleOption *)0x0) && (0 < opt->version)) && (0xeffff < opt->type)) &&
       (((bVar3 = hasStyleRule(this,&w->super_QObject,0x3e), bVar3 ||
         (bVar3 = hasStyleRule(this,&w->super_QObject,0x40), bVar3)) ||
        (bVar3 = hasStyleRule(this,&w->super_QObject,0x3f), QVar12 = local_200, bVar3)))) {
      local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_1d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      pQStack_1d0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_1f8.d = (Data *)0xd;
      local_1f8.ptr = (QVariant *)0x671148;
      QHash<QString,_QVariant>::value<QLatin1String,_true>
                ((QVariant *)local_c8,&local_150.styleHints,(QLatin1String *)&local_1f8);
      ::QVariant::toList();
      ::QVariant::~QVariant((QVariant *)local_c8);
      if (local_1c8 == (undefined1 *)0x0) {
        layout.m_data = "mNX";
        layout.m_size = 3;
        subControlLayout((QList<QVariant> *)&local_1f8,layout);
        local_c8._16_8_ = local_1c8;
        local_c8._8_8_ = pQStack_1d0;
        local_c8._0_8_ = local_1d8;
        local_1c8 = (undefined1 *)local_1f8.size;
        pQStack_1d0 = (QPalettePrivate *)local_1f8.ptr;
        local_1d8 = (undefined1  [8])local_1f8.d;
        local_1f8.size = 0;
        local_1f8.d = (Data *)0x0;
        local_1f8.ptr = (QVariant *)0x0;
        QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_c8);
        QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_1f8);
        if (local_1c8 != (undefined1 *)0x0) goto LAB_00364d51;
        uVar20 = 0;
        QVar12.wd.m_i = 0;
        QVar12.ht.m_i = 0;
      }
      else {
LAB_00364d51:
        pQVar13 = pQStack_1d0 + (long)local_1c8 * 0x20;
        QVar12.wd.m_i = 0;
        QVar12.ht.m_i = 0;
        uVar21 = 0;
        pQVar22 = pQStack_1d0;
        do {
          uVar6 = ::QVariant::toInt((bool *)pQVar22);
          uVar20 = uVar21;
          if ((0xfffffffc < uVar6 - 0x41) &&
             ((knownPseudoElements[uVar6].subControl & opt[1].version) != SC_None)) {
            memset(local_c8,0xaa,0x88);
            renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,uVar6);
            if (local_70.d.ptr == (QStyleSheetGeometryData *)0x0) {
              uVar20 = 0xffffffff;
              if ((local_60.d.ptr == (QStyleSheetImageData *)0x0) ||
                 ((((QSize *)((long)local_60.d.ptr + 0x14))->wd).m_i < 0)) {
                QVar14.wd.m_i = -1;
                QVar14.ht.m_i = 0;
              }
              else {
                QVar14.wd.m_i = -1;
                QVar14.ht.m_i = 0;
                if (-1 < ((Representation *)((long)local_60.d.ptr + 0x18))->m_i) {
                  QVar14 = *(QSize *)((long)local_60.d.ptr + 0x14);
                  uVar20 = (ulong)QVar14 >> 0x20;
                }
              }
            }
            else {
              QVar14.ht.m_i = 0;
              QVar14.wd.m_i = *(int *)((long)local_70.d.ptr + 0xc);
              uVar20 = (ulong)(uint)*(int *)((long)local_70.d.ptr + 0x10);
            }
            local_1f8.d = (Data *)((ulong)QVar14 & 0xffffffff | uVar20 << 0x20);
            QVar14 = QRenderRule::boxSize((QRenderRule *)local_c8,(QSize *)&local_1f8,7);
            QVar12.wd.m_i = QVar12.wd.m_i.m_i + QVar14.wd.m_i.m_i;
            QVar12.ht.m_i = 0;
            uVar20 = (ulong)QVar14 >> 0x20;
            if (QVar14.ht.m_i.m_i < (int)uVar21) {
              uVar20 = uVar21;
            }
            QRenderRule::~QRenderRule((QRenderRule *)local_c8);
          }
          pQVar22 = pQVar22 + 0x20;
          uVar21 = uVar20;
        } while (pQVar22 != pQVar13);
      }
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_1d8);
      goto LAB_003659c4;
    }
    break;
  case CT_ItemViewItem:
    memset((QRenderRule *)local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x4a);
    pQVar11 = baseStyle(this);
    local_200 = (QSize)(**(code **)(*(long *)pQVar11 + 0xe8))(pQVar11,0x16,opt,csz,w);
    local_200 = QRenderRule::adjustSize((QRenderRule *)local_c8,&local_200);
    QVar14 = local_200;
    QVar12 = local_200;
    if (local_80.d.ptr != (QStyleSheetBorderData *)0x0 ||
        local_90.d.ptr != (QStyleSheetBoxData *)0x0) {
      local_200 = QRenderRule::boxSize((QRenderRule *)local_c8,&local_200,7);
      QVar14 = local_200;
      QVar12 = local_200;
    }
LAB_00365c33:
    uVar20 = (ulong)QVar14 >> 0x20;
LAB_00365c3f:
    QRenderRule::~QRenderRule((QRenderRule *)local_c8);
    goto LAB_003659c4;
  }
switchD_00364a30_caseD_11:
  local_200 = QVar12;
  pQVar11 = baseStyle(this);
  QVar12 = (QSize)(**(code **)(*(long *)pQVar11 + 0xe8))(pQVar11,ct,opt,&local_200,w);
LAB_003659c0:
  uVar20 = (ulong)QVar12 >> 0x20;
LAB_003659c4:
  QRenderRule::~QRenderRule(&local_150);
  if (pQVar1 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
LAB_003659e4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)((ulong)QVar12 & 0xffffffff | uVar20 << 0x20);
  }
  __stack_chk_fail();
switchD_00364a30_caseD_0:
  local_200 = QVar12;
  if ((local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
     ((local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
      (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d).
        ptr == (QStyleSheetBorderImageData *)0x0 &&
       (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) == BorderStyle_Native)))))) {
    bVar3 = QRenderRule::baseStyleCanDraw(&local_150);
    if (bVar3) {
      pQVar11 = baseStyle(this);
      local_200 = (QSize)(**(code **)(*(long *)pQVar11 + 0xe8))(pQVar11,ct,opt,&local_200,w);
    }
    else {
      local_200 = QWindowsStyle::sizeFromContents((QWindowsStyle *)this,ct,opt,&local_200,w);
    }
    iVar10 = 9;
  }
  else {
    if (ct == CT_ComboBox) {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,8);
      QVar25 = positionRect(this,w,&local_150,(QRenderRule *)local_c8,8,&opt->rect,opt->direction);
      local_200.wd.m_i = ((QVar25.x2.m_i.m_i + local_200.wd.m_i) - QVar25.x1.m_i) + 3;
      QRenderRule::~QRenderRule((QRenderRule *)local_c8);
    }
LAB_00365428:
    iVar10 = 7;
  }
  QVar12 = QRenderRule::boxSize(&local_150,&local_200,iVar10);
  goto LAB_003659c0;
}

Assistant:

QSize QStyleSheetStyle::sizeFromContents(ContentsType ct, const QStyleOption *opt,
                                         const QSize &csz, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->sizeFromContents(ct, opt, csz, w))

    QRenderRule rule = renderRule(w, opt);
    QSize sz = rule.adjustSize(csz);

    switch (ct) {
#if QT_CONFIG(spinbox)
    case CT_SpinBox:
        if (const QStyleOptionSpinBox *spinbox = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            if (rule.baseStyleCanDraw()) {
                sz = baseStyle()->sizeFromContents(ct, opt, sz, w);
            } else if (spinbox->buttonSymbols != QAbstractSpinBox::NoButtons) {
                // Add some space for the up/down buttons
                QRenderRule subRule = renderRule(w, opt, PseudoElement_SpinBoxUpButton);
                if (subRule.hasDrawable()) {
                    QRect r = positionRect(w, rule, subRule, PseudoElement_SpinBoxUpButton,
                                           opt->rect, opt->direction);
                    sz.rwidth() += r.width();
                } else {
                    QSize defaultUpSize = defaultSize(w, subRule.size(), spinbox->rect, PseudoElement_SpinBoxUpButton);
                    sz.rwidth() += defaultUpSize.width();
                }
            }
            if (rule.hasBox() || rule.hasBorder() || !rule.hasNativeBorder())
                sz = rule.boxSize(sz);
            return sz;
        }
        break;
#endif // QT_CONFIG(spinbox)
    case CT_ToolButton:
        if (rule.hasBox() || !rule.hasNativeBorder() || !rule.baseStyleCanDraw())
            sz += QSize(3, 3); // ### broken QToolButton
        Q_FALLTHROUGH();
    case CT_ComboBox:
    case CT_PushButton:
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            if (ct == CT_ComboBox) {
                //add some space for the drop down.
                QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                QRect comboRect = positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown, opt->rect, opt->direction);
                //+2 because there is hardcoded margins in QCommonStyle::drawControl(CE_ComboBoxLabel)
                sz += QSize(comboRect.width() + 2, 0);
            }
            return rule.boxSize(sz);
        }
        sz = rule.baseStyleCanDraw() ? baseStyle()->sizeFromContents(ct, opt, sz, w)
                                     : QWindowsStyle::sizeFromContents(ct, opt, sz, w);
        return rule.boxSize(sz, Margin);

    case CT_HeaderSection: {
            if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
                QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewSection);
                if (subRule.hasGeometry() || subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
                    sz = subRule.adjustSize(csz);
                    if (!sz.isValid()) {
                        // Try to set the missing values based on the base style.
                        const auto baseSize = baseStyle()->sizeFromContents(ct, opt, sz, w);
                        if (sz.width() < 0)
                            sz.setWidth(baseSize.width());
                        if (sz.height() < 0)
                            sz.setHeight(baseSize.height());
                    }
                    if (!subRule.hasGeometry()) {
                        QSize nativeContentsSize;
                        bool nullIcon = hdr->icon.isNull();
                        const int margin = pixelMetric(QStyle::PM_HeaderMargin, hdr, w);
                        int iconSize = nullIcon ? 0 : pixelMetric(QStyle::PM_SmallIconSize, hdr, w);
                        QFontMetrics fm = hdr->fontMetrics;
                        if (subRule.hasFont) {
                            QFont styleFont = w ? subRule.font.resolve(w->font()) : subRule.font;
                            fm = QFontMetrics(styleFont);
                        }
                        const QSize txt = fm.size(0, hdr->text);
                        nativeContentsSize.setHeight(margin + qMax(iconSize, txt.height()) + margin);
                        nativeContentsSize.setWidth((nullIcon ? 0 : margin) + iconSize
                                                    + (hdr->text.isNull() ? 0 : margin) + txt.width() + margin);
                        sz = sz.expandedTo(nativeContentsSize);
                    }
                    return subRule.size(sz);
                }
                sz = subRule.baseStyleCanDraw() ? baseStyle()->sizeFromContents(ct, opt, sz, w)
                                                : QWindowsStyle::sizeFromContents(ct, opt, sz, w);
                if (hasStyleRule(w, PseudoElement_HeaderViewDownArrow)
                 || hasStyleRule(w, PseudoElement_HeaderViewUpArrow)) {
                    const QRect arrowRect = subElementRect(SE_HeaderArrow, opt, w);
                    if (hdr->orientation == Qt::Horizontal)
                        sz.rwidth() += arrowRect.width();
                    else
                        sz.rheight() += arrowRect.height();
                }
                return sz;
            }
        }
        break;
    case CT_GroupBox:
    case CT_LineEdit:
#if QT_CONFIG(spinbox)
        if (qobject_cast<QAbstractSpinBox *>(w ? w->parentWidget() : nullptr))
            return csz; // we only care about the size hint of the line edit
#endif
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            return rule.boxSize(sz);
        }
        break;

    case CT_CheckBox:
    case CT_RadioButton:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
                bool isRadio = (ct == CT_RadioButton);
                int iw = pixelMetric(isRadio ? PM_ExclusiveIndicatorWidth
                                             : PM_IndicatorWidth, btn, w);
                int ih = pixelMetric(isRadio ? PM_ExclusiveIndicatorHeight
                                             : PM_IndicatorHeight, btn, w);

                int spacing = pixelMetric(isRadio ? PM_RadioButtonLabelSpacing
                                                  : PM_CheckBoxLabelSpacing, btn, w);
                sz.setWidth(sz.width() + iw + spacing);
                sz.setHeight(qMax(sz.height(), ih));
                return rule.boxSize(sz);
            }
        }
        break;

    case CT_Menu:
    case CT_MenuBar: // already has everything!
    case CT_ScrollBar:
        if (rule.hasBox() || rule.hasBorder())
            return sz;
        break;

    case CT_MenuItem:
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            PseudoElement pe = (mi->menuItemType == QStyleOptionMenuItem::Separator)
                                    ? PseudoElement_MenuSeparator : PseudoElement_Item;
            QRenderRule subRule = renderRule(w, opt, pe);
            if ((pe == PseudoElement_MenuSeparator) && subRule.hasContentsSize()) {
                return QSize(sz.width(), subRule.size().height());
            }
            if ((pe == PseudoElement_Item) && (subRule.hasBox() || subRule.hasBorder() || subRule.hasFont)) {
                bool drawCheckMark = mi->menuHasCheckableItems;
#if QT_CONFIG(combobox)
                if (qobject_cast<const QComboBox *>(w))
                    drawCheckMark = false; // ignore the checkmarks provided by the QComboMenuDelegate
#endif
                QSize sz(csz);
                if (subRule.hasFont) {
                    QFontMetrics fm(subRule.font.resolve(mi->font));
                    const QRect r = fm.boundingRect(QRect(), Qt::TextSingleLine | Qt::TextShowMnemonic, mi->text);
                    sz = sz.expandedTo(r.size());
                }
                if (mi->text.contains(u'\t'))
                    sz.rwidth() += 12; //as in QCommonStyle
                if (!mi->icon.isNull()) {
                    const int pmSmall = pixelMetric(PM_SmallIconSize);
                    const QSize pmSize = mi->icon.actualSize(QSize(pmSmall, pmSmall));
                    sz.rwidth() += std::max(mi->maxIconWidth, pmSize.width()) + 4;
                } else if (drawCheckMark) {
                    QRenderRule subSubRule = renderRule(w, opt, PseudoElement_MenuCheckMark);
                    QRect checkmarkRect = positionRect(w, subRule, subSubRule, PseudoElement_MenuCheckMark, opt->rect, opt->direction);
                    sz.rwidth() += std::max(mi->maxIconWidth, checkmarkRect.width()) + 4;
                } else {
                    sz.rwidth() += mi->maxIconWidth;
                }
                return subRule.boxSize(subRule.adjustSize(sz));
            }
        }
        break;

    case CT_Splitter:
    case CT_MenuBarItem: {
        PseudoElement pe = (ct == CT_Splitter) ? PseudoElement_SplitterHandle : PseudoElement_Item;
        QRenderRule subRule = renderRule(w, opt, pe);
        if (subRule.hasBox() || subRule.hasBorder())
            return subRule.boxSize(sz);
        break;
                        }

    case CT_ProgressBar:
    case CT_SizeGrip:
        return (rule.hasContentsSize())
            ? rule.size(sz)
            : rule.boxSize(baseStyle()->sizeFromContents(ct, opt, sz, w));
        break;

    case CT_Slider:
        if (rule.hasBorder() || rule.hasBox() || rule.hasGeometry())
            return rule.boxSize(sz);
        break;

#if QT_CONFIG(tabbar)
    case CT_TabBarTab: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
            int spaceForIcon = 0;
            bool vertical = false;
            QString text;
            if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                if (!tab->icon.isNull())
                    spaceForIcon = 6 /* icon offset */ + 4 /* spacing */ + 2 /* magic */; // ###: hardcoded to match with common style
                vertical = verticalTabs(tab->shape);
                text = tab->text;
            }
            if (subRule.hasBox() || !subRule.hasNativeBorder())
                sz = csz + QSize(vertical ? 0 : spaceForIcon, vertical ? spaceForIcon : 0);
            if (subRule.hasFont) {
                // first we remove the space needed for the text using the default font
                const QSize oldTextSize = opt->fontMetrics.size(Qt::TextShowMnemonic, text);
                (vertical ? sz.rheight() : sz.rwidth()) -= oldTextSize.width();

                // then we add the space needed when using the rule font to the relevant
                // dimension, and constraint the other dimension to the maximum to make
                // sure we don't grow, but also don't clip icons or buttons.
                const QFont ruleFont = subRule.font.resolve(w->font());
                const QFontMetrics fm(ruleFont);
                const QSize textSize = fm.size(Qt::TextShowMnemonic, text);
                if (vertical) {
                    sz.rheight() += textSize.width();
                    sz.rwidth() = qMax(textSize.height(), sz.width());
                } else {
                    sz.rwidth() += textSize.width();
                    sz.rheight() = qMax(textSize.height(), sz.height());
                }
            }

            return subRule.boxSize(subRule.adjustSize(sz));
        }
        sz = subRule.adjustSize(csz);
        break;
    }
#endif // QT_CONFIG(tabbar)

    case CT_MdiControls:
        if (const QStyleOptionComplex *ccOpt = qstyleoption_cast<const QStyleOptionComplex *>(opt)) {
            if (!hasStyleRule(w, PseudoElement_MdiCloseButton)
                && !hasStyleRule(w, PseudoElement_MdiNormalButton)
                && !hasStyleRule(w, PseudoElement_MdiMinButton))
                break;

            QList<QVariant> layout = rule.styleHint("button-layout"_L1).toList();
            if (layout.isEmpty())
                layout = subControlLayout("mNX");

            int width = 0, height = 0;
            for (const QVariant &val : std::as_const(layout)) {
                int layoutButton = val.toInt();
                if (layoutButton < PseudoElement_MdiCloseButton
                    || layoutButton > PseudoElement_MdiNormalButton)
                    continue;
                QStyle::SubControl sc = knownPseudoElements[layoutButton].subControl;
                if (!(ccOpt->subControls & sc))
                    continue;
                QRenderRule subRule = renderRule(w, opt, layoutButton);
                QSize sz = subRule.size();
                width += sz.width();
                height = qMax(height, sz.height());
            }

            return QSize(width, height);
        }
        break;

#if QT_CONFIG(itemviews)
    case CT_ItemViewItem: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_ViewItem);
        sz = baseStyle()->sizeFromContents(ct, opt, csz, w);
        sz = subRule.adjustSize(sz);
        if (subRule.hasBox() || subRule.hasBorder())
            sz = subRule.boxSize(sz);
        return sz;
                      }
#endif // QT_CONFIG(itemviews)

    default:
        break;
    }

    return baseStyle()->sizeFromContents(ct, opt, sz, w);
}